

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O3

void __thiscall ON_SerialNumberMap::GarbageCollectHelper(ON_SerialNumberMap *this)

{
  ulong *puVar1;
  size_t sz;
  undefined8 *puVar2;
  ON__UINT64 *pOVar3;
  ON_SerialNumberMapPrivate *pOVar4;
  ON_SN_BLOCK *pOVar5;
  int iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ON__UINT64 OVar9;
  ON__UINT64 OVar10;
  undefined8 uVar11;
  ulong uVar12;
  ulong uVar13;
  ON_SerialNumberMap *this_00;
  long lVar14;
  ON_SN_BLOCK **ppOVar15;
  ON_SN_BLOCK *pOVar16;
  long lVar17;
  uint uVar18;
  SN_ELEMENT *pSVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  ON__UINT64 OVar23;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  
  if (this->m_bHashTableIsValid != '\0') {
    this->m_bHashTableIsValid = '\0';
  }
  pOVar16 = this->m_sn_block0;
  uVar25 = pOVar16->m_purged;
  if (uVar25 == 0) {
    if (pOVar16->m_sorted != 0) {
      OVar23 = this->m_snblk_list_count;
      goto LAB_004d073e;
    }
    ON_SN_BLOCK::SortBlockHelper(pOVar16);
    OVar23 = this->m_snblk_list_count;
    pOVar16 = this->m_sn_block0;
    if (OVar23 == 0) {
      pOVar4 = this->m_private;
      uVar12 = pOVar16->m_sn1;
      pOVar4->m_maxsn = uVar12;
      if (uVar12 < 0xffffffff) {
        pOVar4->m_lower_maxsn = uVar12;
      }
      this->m_sn_purged = 0;
      this->m_sn_count = (ulong)pOVar16->m_count;
      goto LAB_004d0c20;
    }
    this->m_sn_purged = 0;
    uVar12 = (ulong)pOVar16->m_count;
    this->m_sn_count = uVar12;
  }
  else {
    this->m_sn_count = this->m_sn_count - (ulong)uVar25;
    this->m_sn_purged = this->m_sn_purged - (ulong)uVar25;
    ON_SN_BLOCK::CullBlockHelper(pOVar16);
    pOVar16 = this->m_sn_block0;
    if (pOVar16->m_sorted == 0) {
      ON_SN_BLOCK::SortBlockHelper(pOVar16);
      pOVar16 = this->m_sn_block0;
    }
    OVar23 = this->m_snblk_list_count;
    if (OVar23 == 0) {
      pOVar4 = this->m_private;
      uVar12 = pOVar16->m_sn1;
      pOVar4->m_maxsn = uVar12;
      if (uVar12 < 0xffffffff) {
        pOVar4->m_lower_maxsn = uVar12;
      }
    }
    if (pOVar16->m_count < 0x1c00) {
      return;
    }
LAB_004d073e:
    this->m_sn_purged = 0;
    uVar12 = (ulong)pOVar16->m_count;
    this->m_sn_count = uVar12;
    if (OVar23 == 0) goto LAB_004d0c20;
  }
  ppOVar15 = this->m_snblk_list;
  do {
    pOVar16 = ppOVar15[OVar23 - 1];
    OVar23 = OVar23 - 1;
    if (pOVar16->m_purged != 0) {
      ON_SN_BLOCK::CullBlockHelper(pOVar16);
      uVar12 = this->m_sn_count;
      ppOVar15 = this->m_snblk_list;
      pOVar16 = ppOVar15[OVar23];
    }
    uVar12 = uVar12 + pOVar16->m_count;
    this->m_sn_count = uVar12;
  } while (OVar23 != 0);
  uVar12 = this->m_snblk_list_count;
  if (uVar12 != 0) {
    uVar13 = 0;
    this_00 = (ON_SerialNumberMap *)this->m_snblk_list;
    do {
      uVar24 = uVar13;
      if ((int)this_00->m_private->m_maxsn == 0) goto LAB_004d0bae;
      uVar13 = uVar13 + 1;
      this_00 = (ON_SerialNumberMap *)&this_00->m_sn_count;
    } while (uVar12 != uVar13);
LAB_004d07e1:
    if (this->m_sn_block0->m_sn0 < this->m_snblk_list[uVar12 - 1]->m_sn1) {
      this_00 = (ON_SerialNumberMap *)onmalloc(0xe0000);
      uVar12 = this->m_snblk_list_count;
      if (uVar12 != 0) {
        uVar13 = 0;
        do {
          pOVar16 = this->m_sn_block0;
          if (pOVar16->m_count == 0) break;
          pOVar5 = this->m_snblk_list[uVar13];
          if (pOVar16->m_sn0 <= pOVar5->m_sn1) {
            if (uVar13 < uVar12 - 1) {
              OVar23 = this->m_snblk_list[uVar13 + 1]->m_sn0;
            }
            else {
              OVar23 = pOVar16->m_sn1 + 1;
            }
            uVar25 = pOVar5->m_count;
            if (uVar25 == 0) {
              uVar24 = 0;
              uVar12 = 0;
LAB_004d094e:
              pOVar16 = this->m_sn_block0;
              uVar21 = pOVar16->m_count;
              if (((uint)uVar12 < uVar21) && (pOVar16->m_sn[uVar12].m_sn < OVar23)) {
                pSVar19 = pOVar16->m_sn + (uVar12 - 1);
                uVar26 = uVar12;
                lVar17 = uVar12 * 0x38 + 0x68;
                do {
                  uVar12 = uVar12 + 1;
                  lVar14 = uVar24 * 0x38;
                  *(anon_union_8_5_72d3814f_for_m_u *)
                   ((long)&this_00->m_inactive_id + lVar14 + -0x30) = pSVar19[1].m_value.m_u;
                  uVar7 = *(undefined8 *)&pSVar19[1].m_id;
                  uVar8 = *(undefined8 *)pSVar19[1].m_id.Data4;
                  OVar9 = pSVar19[1].m_sn;
                  OVar10 = *(ON__UINT64 *)&pSVar19[1].m_sn_active;
                  uVar11 = *(undefined8 *)&pSVar19[1].m_value;
                  puVar2 = (undefined8 *)((long)&this_00->m_inactive_id + lVar14 + -0x40);
                  *puVar2 = pSVar19[1].m_next;
                  puVar2[1] = uVar11;
                  pOVar3 = (ON__UINT64 *)((long)&this_00->m_inactive_id + lVar14 + -0x50);
                  *pOVar3 = OVar9;
                  pOVar3[1] = OVar10;
                  puVar2 = (undefined8 *)((long)&this_00->m_inactive_id + lVar14 + -0x60);
                  *puVar2 = uVar7;
                  puVar2[1] = uVar8;
                  pOVar16 = this->m_sn_block0;
                  uVar21 = pOVar16->m_count;
                  iVar6 = (int)uVar24;
                  if (uVar21 <= uVar12) break;
                  pSVar19 = pOVar16->m_sn + uVar26;
                  uVar24 = (ulong)(iVar6 + 1);
                  puVar1 = (ulong *)((long)(&pOVar16->m_sn[0].m_id + -2) + lVar17);
                  uVar26 = uVar26 + 1;
                  lVar17 = lVar17 + 0x38;
                } while (*puVar1 < OVar23);
                uVar24 = (ulong)(iVar6 + 1);
              }
            }
            else {
              pOVar16 = this->m_sn_block0;
              if (pOVar16->m_count == 0) {
                uVar21 = 0;
                uVar12 = 0;
                uVar24 = 0;
              }
              else {
                uVar26 = 0;
                uVar12 = 0;
                uVar20 = 0;
                do {
                  uVar18 = uVar20;
                  uVar24 = (ulong)uVar18;
                  uVar21 = (uint)uVar26;
                  uVar22 = pOVar16->m_sn[uVar12].m_sn;
                  if (pOVar5->m_sn[uVar26].m_sn < uVar22) {
                    pSVar19 = pOVar5->m_sn + uVar26;
                    uVar26 = (ulong)(uVar21 + 1);
                  }
                  else {
                    if (OVar23 <= uVar22) {
                      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_lookup.cpp"
                                 ,0x61b,"","Bogus information - should never get here");
                      uVar25 = pOVar5->m_count;
                      goto LAB_004d0940;
                    }
                    pSVar19 = pOVar16->m_sn + uVar12;
                    uVar12 = (ulong)((int)uVar12 + 1);
                  }
                  lVar17 = uVar24 * 0x38;
                  *(anon_union_8_5_72d3814f_for_m_u *)
                   ((long)&this_00->m_inactive_id + lVar17 + -0x30) = (pSVar19->m_value).m_u;
                  uVar7 = *(undefined8 *)&pSVar19->m_id;
                  uVar8 = *(undefined8 *)(pSVar19->m_id).Data4;
                  OVar9 = pSVar19->m_sn;
                  OVar10 = *(ON__UINT64 *)&pSVar19->m_sn_active;
                  uVar11 = *(undefined8 *)&pSVar19->m_value;
                  puVar2 = (undefined8 *)((long)&this_00->m_inactive_id + lVar17 + -0x40);
                  *puVar2 = pSVar19->m_next;
                  puVar2[1] = uVar11;
                  pOVar3 = (ON__UINT64 *)((long)&this_00->m_inactive_id + lVar17 + -0x50);
                  *pOVar3 = OVar9;
                  pOVar3[1] = OVar10;
                  puVar2 = (undefined8 *)((long)&this_00->m_inactive_id + lVar17 + -0x60);
                  *puVar2 = uVar7;
                  puVar2[1] = uVar8;
                  uVar25 = pOVar5->m_count;
                  uVar21 = (uint)uVar26;
                  if (uVar25 <= uVar21) break;
                  pOVar16 = this->m_sn_block0;
                  uVar20 = uVar18 + 1;
                } while ((uint)uVar12 < pOVar16->m_count);
                uVar24 = (ulong)(uVar18 + 1);
              }
LAB_004d0940:
              uVar25 = uVar25 - uVar21;
              if (uVar25 == 0) goto LAB_004d094e;
              memcpy((void *)((long)&this_00->m_inactive_id + uVar24 * 0x38 + -0x60),
                     pOVar5->m_sn + uVar21,(ulong)uVar25 * 0x38);
              pOVar16 = this->m_sn_block0;
              uVar21 = pOVar16->m_count;
              uVar24 = (ulong)(uVar25 + (int)uVar24);
            }
            uVar25 = (uint)uVar24;
            uVar26 = 0x2000;
            if (uVar25 < 0x2000) {
              uVar26 = uVar24;
            }
            uVar20 = (uint)uVar12;
            if (uVar20 <= uVar21 && uVar21 - uVar20 != 0) {
              memcpy((void *)((long)&this_00->m_inactive_id + uVar24 * 0x38 + -0x60),
                     pOVar16->m_sn + (uVar12 & 0xffffffff),(ulong)(uVar21 - uVar20) * 0x38);
              uVar25 = (uVar25 - uVar20) + this->m_sn_block0->m_count;
            }
            uVar20 = (uint)uVar26;
            pOVar5->m_count = uVar20;
            memcpy(pOVar5->m_sn,this_00,uVar26 * 0x38);
            pOVar5->m_sn0 = pOVar5->m_sn[0].m_sn;
            pOVar5->m_sn1 = pOVar5->m_sn[uVar20 - 1].m_sn;
            uVar21 = uVar25 - uVar20;
            if (uVar25 < uVar20 || uVar21 == 0) {
              pOVar16 = this->m_sn_block0;
              pOVar16->m_count = 0;
              pOVar16->m_purged = 0;
              pOVar16->m_sorted = 1;
              pOVar16->m_sn0 = 0;
              pOVar16->m_sn1 = 0;
            }
            else {
              pOVar16 = this->m_sn_block0;
              pOVar16->m_count = uVar21;
              memcpy(pOVar16->m_sn,(void *)((long)&this_00->m_inactive_id + (uVar26 * 0x38 - 0x60)),
                     (ulong)uVar21 * 0x38);
              pOVar16 = this->m_sn_block0;
              pOVar16->m_sn0 = pOVar16->m_sn[0].m_sn;
              pOVar16->m_sn1 = pOVar16->m_sn[pOVar16->m_count - 1].m_sn;
            }
          }
          uVar13 = uVar13 + 1;
          uVar12 = this->m_snblk_list_count;
        } while (uVar13 < uVar12);
      }
      onfree(this_00);
      uVar12 = this->m_snblk_list_count;
      if (uVar12 == 0) goto LAB_004d0c20;
    }
    uVar24 = 2;
    uVar13 = 0;
    do {
      uVar26 = uVar13 + 1;
      if (uVar26 < uVar12) {
        ppOVar15 = this->m_snblk_list;
        pOVar16 = ppOVar15[uVar13];
        uVar25 = pOVar16->m_count;
        uVar22 = uVar24;
        while (uVar25 < 0x2000) {
          GarbageCollectMoveHelper(this_00,pOVar16,ppOVar15[uVar22 - 1]);
          uVar12 = this->m_snblk_list_count;
          if (uVar12 <= uVar22) break;
          ppOVar15 = this->m_snblk_list;
          pOVar16 = ppOVar15[uVar13];
          uVar22 = uVar22 + 1;
          uVar25 = pOVar16->m_count;
        }
      }
      uVar24 = uVar24 + 1;
      uVar13 = uVar26;
    } while (uVar26 < uVar12);
    if (uVar12 != 0) {
      do {
        uVar12 = uVar12 - 1;
        if (this->m_snblk_list[uVar12]->m_count != 0) {
          if (this->m_sn_block0->m_count < 0x801) {
            return;
          }
          GarbageCollectMoveHelper(this_00,this->m_snblk_list[uVar12],this->m_sn_block0);
          uVar25 = this->m_sn_block0->m_count;
          goto LAB_004d0c31;
        }
        this->m_snblk_list_count = uVar12;
      } while (uVar12 != 0);
    }
  }
LAB_004d0c20:
  uVar25 = this->m_sn_block0->m_count;
  if (0x800 < uVar25) {
LAB_004d0c31:
    if (0x1000 < uVar25) {
      uVar12 = this->m_snblk_list_count;
      if (uVar12 == this->m_snblk_list_capacity) {
        this->m_snblk_list_capacity = uVar12 + 0x20;
        sz = uVar12 * 8 + 0x100;
        if (this->m_snblk_list == (ON_SN_BLOCK **)0x0) {
          ppOVar15 = (ON_SN_BLOCK **)onmalloc(sz);
        }
        else {
          ppOVar15 = (ON_SN_BLOCK **)onrealloc(this->m_snblk_list,sz);
        }
        this->m_snblk_list = ppOVar15;
        uVar13 = this->m_snblk_list_capacity;
        if (uVar12 < uVar13) {
          do {
            this->m_snblk_list[uVar12] = (ON_SN_BLOCK *)0x0;
            uVar12 = uVar12 + 1;
          } while (uVar13 != uVar12);
        }
      }
      OVar23 = this->m_snblk_list_count;
      pOVar16 = this->m_snblk_list[OVar23];
      if (pOVar16 == (ON_SN_BLOCK *)0x0) {
        pOVar16 = (ON_SN_BLOCK *)onmalloc(0x70020);
        OVar23 = this->m_snblk_list_count;
        this->m_snblk_list[OVar23] = pOVar16;
        pOVar16 = this->m_snblk_list[OVar23];
      }
      this->m_snblk_list_count = OVar23 + 1;
      memcpy(pOVar16,this->m_sn_block0,0x70020);
      pOVar16 = this->m_sn_block0;
      pOVar16->m_count = 0;
      pOVar16->m_purged = 0;
      pOVar16->m_sorted = 1;
      pOVar16->m_sn0 = 0;
      pOVar16->m_sn1 = 0;
    }
  }
  return;
  while (lVar17 = uVar24 * 8, uVar24 = uVar24 + 1,
        **(int **)((((ON_SerialNumberMap *)this->m_snblk_list)->m_inactive_id).Data4 +
                  lVar17 + -0x60) == 0) {
LAB_004d0bae:
    if (uVar12 <= uVar24 + 1) goto LAB_004d0bd8;
  }
  ON_qsort(this_00,uVar12 - uVar13,8,ON_SN_BLOCK::CompareMaxSN);
  uVar12 = this->m_snblk_list_count;
LAB_004d0bd8:
  if (uVar12 != 0) {
    do {
      if (this->m_snblk_list[uVar12 - 1]->m_count != 0) goto LAB_004d07e1;
      uVar12 = uVar12 - 1;
      this->m_snblk_list_count = uVar12;
    } while (uVar12 != 0);
  }
  goto LAB_004d0c20;
}

Assistant:

void ON_SerialNumberMap::GarbageCollectHelper()
{
  ON__UINT64 i,m;
  ON__UINT32 j,k,n;

  // This is a helper function.  The caller
  // should check that ON_SN_BLOCK::SN_BLOCK_CAPACITY == m_sn_block0.m_count
  // before calling it.

  // memory location for specific elements will be changed.
  // This will make the hash table invalid.
  Internal_HashTableInvalidate();

  if ( m_sn_block0.m_purged > 0 )
  {
    m_sn_count -= m_sn_block0.m_purged;
    m_sn_purged -= m_sn_block0.m_purged;
    m_sn_block0.CullBlockHelper();
    if ( !m_sn_block0.m_sorted )
      m_sn_block0.SortBlockHelper();
    if ( 0 == m_snblk_list_count )
      m_private->SetMaxSn(m_sn_block0.m_sn1);
    if ( m_sn_block0.m_count < 7*(ON_SN_BLOCK::SN_BLOCK_CAPACITY/8) )
      return;
  }
  else if ( !m_sn_block0.m_sorted )
  {
    m_sn_block0.SortBlockHelper();
    if ( 0 == m_snblk_list_count )
      m_private->SetMaxSn(m_sn_block0.m_sn1);
  }

  // Remove all purged serial numbers from every block
  // and make sure every block is sorted.
  m_sn_purged = 0;
  m_sn_count = m_sn_block0.m_count;
  i = m_snblk_list_count;
  while (i--)
  {
    if ( m_snblk_list[i]->m_purged > 0 )
    {
      // The next call may empty m_snblk_list[i].
      m_snblk_list[i]->CullBlockHelper();
    }
    m_sn_count += m_snblk_list[i]->m_count;
  }

  // Put empty blocks at the end of the list
  for ( i = 0; i < m_snblk_list_count; i++ )
  {
    if ( 0 == m_snblk_list[i]->m_count )
    {
      // m_snblk_list[i] is empty ...
      for(m = i+1; m < m_snblk_list_count; m++ )
      {
        if ( m_snblk_list[m]->m_count > 0 )
        {
          // ... and m_snblk_list[m] is not empty
          ON_qsort(m_snblk_list+i,(size_t)(m_snblk_list_count-i),sizeof(*m_snblk_list),ON_SN_BLOCK::CompareMaxSN);
          break;
        }
      }
      while ( m_snblk_list_count > 0 && 0 == m_snblk_list[m_snblk_list_count-1]->m_count )
        m_snblk_list_count--;
      break;
    }
  }

  if (    m_snblk_list_count > 0 
       && m_snblk_list[m_snblk_list_count-1]->m_sn1 > m_sn_block0.m_sn0 
     )
  {
    // Merge the serial number lists so the blocks in m_sn_list[]
    // have the lowest serial numbers and m_sn_block0.m_sn[] contains
    // the largest.
    ON__UINT32 snarray_count = 0;
    struct SN_ELEMENT* snarray = (struct SN_ELEMENT*)onmalloc(2*ON_SN_BLOCK::SN_BLOCK_CAPACITY*sizeof(snarray[0]));
    for ( i = 0; i < m_snblk_list_count && m_sn_block0.m_count > 0; i++ )
    {
      if ( m_snblk_list[i]->m_sn1 < m_sn_block0.m_sn0 )
        continue;

      // Move some entries in m_sn_block0.m_sn[] 
      // to m_snblk_list[i]->m_sn[].
      ON_SN_BLOCK* blk = m_snblk_list[i];
      const ON__UINT64 sn1 = (i < m_snblk_list_count-1) 
                             ? m_snblk_list[i+1]->m_sn0 
                             : (m_sn_block0.m_sn1+1);
      snarray_count = j = k = 0;
      while(j < blk->m_count && k < m_sn_block0.m_count )
      {
        if ( blk->m_sn[j].m_sn < m_sn_block0.m_sn[k].m_sn )
        {
          snarray[snarray_count++] = blk->m_sn[j++];
        }
        else if ( m_sn_block0.m_sn[k].m_sn < sn1 )
        {
          snarray[snarray_count++] = m_sn_block0.m_sn[k++];
        }
        else
        {
          // If m_sn_block0.m_sn[m_sn_block0.m_count-1].m_sn is the largest
          // value, then we should get j == blk->m_count exit.
          // If blk->m_sn[blk->m_count-1].m_sn is the largest value,
          // then we should get k == m_sn_block0.m_count and exit.
          ON_ERROR("Bogus information - should never get here");
          break;
        }
      }
      n = blk->m_count-j;
      if ( n > 0 )
      {
        memcpy(&snarray[snarray_count],&blk->m_sn[j],(size_t)(n*sizeof(snarray[0])));
        snarray_count += n;
      }
      else
      {
        while ( k < m_sn_block0.m_count && m_sn_block0.m_sn[k].m_sn < sn1 )
          snarray[snarray_count++] = m_sn_block0.m_sn[k++];
      }
      n = (snarray_count > ON_SN_BLOCK::SN_BLOCK_CAPACITY) 
        ? ON_SN_BLOCK::SN_BLOCK_CAPACITY 
        : snarray_count;
      if ( k < m_sn_block0.m_count )
      {
        memcpy(&snarray[snarray_count],
               &m_sn_block0.m_sn[k],
               (size_t)((m_sn_block0.m_count-k)*sizeof(snarray[0]))
               );
        snarray_count += (m_sn_block0.m_count-k);
      }
      blk->m_count = n;
      memcpy(&blk->m_sn[0],snarray,(size_t)(blk->m_count*sizeof(blk->m_sn[0])));
      blk->m_sn0 = blk->m_sn[0].m_sn;
      blk->m_sn1 = blk->m_sn[blk->m_count-1].m_sn;
      if ( snarray_count > n )
      {
        // put the end of snarray[] (the largest serial numbers)
        // in m_sn_block0.m_sn[].
        m_sn_block0.m_count = (snarray_count-n);
        memcpy(&m_sn_block0.m_sn[0],
               &snarray[n],
               (size_t)(m_sn_block0.m_count*sizeof(m_sn_block0.m_sn[0]))
               );
        m_sn_block0.m_sn0 = m_sn_block0.m_sn[0].m_sn;
        m_sn_block0.m_sn1 = m_sn_block0.m_sn[m_sn_block0.m_count-1].m_sn;
      }
      else
      {
        m_sn_block0.EmptyBlock();
      }
    }
    onfree(snarray);
    snarray = 0;
  }

  // Compact the blocks in m_sn_list[]
  for ( i = 0; i < m_snblk_list_count; i++ )
  {
    for ( m = i+1; m < m_snblk_list_count; m++ )
    {
      if ( m_snblk_list[i]->m_count >= ON_SN_BLOCK::SN_BLOCK_CAPACITY )
        break;
      GarbageCollectMoveHelper(m_snblk_list[i],m_snblk_list[m]);
    }
  }
  while ( m_snblk_list_count > 0 && 0 == m_snblk_list[m_snblk_list_count-1]->m_count )
  {
    m_snblk_list_count--;
  }

  // Make sure m_sn_block0.m_an[] is has plenty of room
  if ( m_sn_block0.m_count > ON_SN_BLOCK::SN_BLOCK_CAPACITY/4 )
  {
    if ( m_snblk_list_count > 0 )
    {
      GarbageCollectMoveHelper(m_snblk_list[m_snblk_list_count-1],&m_sn_block0);
    }
    if ( m_sn_block0.m_count > ON_SN_BLOCK::SN_BLOCK_CAPACITY/2 )
    {
      // Need to add a new block to m_snblk_list[]
      if ( m_snblk_list_count == m_snblk_list_capacity )
      {
        // Add room to store more pointers to blocks in the m_sn_list[]
        i = m_snblk_list_capacity;
        m_snblk_list_capacity += 32;
        m = m_snblk_list_capacity*sizeof(m_snblk_list[0]);
        m_snblk_list = (ON_SN_BLOCK**)((0 == m_snblk_list)
                     ? onmalloc((size_t)m)
                     : onrealloc(m_snblk_list,(size_t)m));
        while ( i < m_snblk_list_capacity )
          m_snblk_list[i++] = 0;
      }
      if ( 0 == m_snblk_list[m_snblk_list_count] )
      {
        // add room to store at more serial numbers
        m_snblk_list[m_snblk_list_count] = (ON_SN_BLOCK*)onmalloc(sizeof(*(m_snblk_list[m_snblk_list_count])));
      }
      *m_snblk_list[m_snblk_list_count++] = m_sn_block0;
      m_sn_block0.EmptyBlock();
    }
  }
}